

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O1

decNumber_conflict * decTrim(decNumber_conflict *dn,decContext *set,uint8_t all,int32_t *dropped)

{
  int iVar1;
  int iVar2;
  int shift;
  uint uVar3;
  uint16_t *puVar4;
  int iVar5;
  bool bVar6;
  
  *dropped = 0;
  if (((dn->bits & 0x70) == 0) && ((dn->lsu[0] & 1) == 0)) {
    if ((dn->lsu[0] == 0) && (dn->digits == 1)) {
      dn->exponent = 0;
    }
    else {
      iVar1 = dn->digits;
      shift = 0;
      if (1 < (long)iVar1) {
        iVar2 = 0;
        uVar3 = 1;
        puVar4 = dn->lsu;
        iVar5 = dn->exponent;
        do {
          if ((ulong)((uint)(*puVar4 >> ((byte)uVar3 & 0x1f)) * multies[uVar3] >> 0x11) *
              DECPOWERS[uVar3] - (ulong)*puVar4 == 0) {
            if (iVar5 < 1 && all == '\0') {
              if (iVar5 == 0) {
                iVar5 = 0;
                goto LAB_00b2d371;
              }
              iVar5 = iVar5 + 1;
            }
            bVar6 = 2 < uVar3;
            uVar3 = uVar3 + 1;
            if (bVar6) {
              uVar3 = 1;
            }
            puVar4 = puVar4 + bVar6;
            bVar6 = true;
          }
          else {
LAB_00b2d371:
            bVar6 = false;
          }
          shift = iVar2;
        } while ((bVar6) && (iVar2 = iVar2 + 1, shift = iVar1 + -1, iVar1 + -1 != iVar2));
      }
      if (shift != 0) {
        if (set->clamp != '\0') {
          iVar2 = (set->emax - (dn->exponent + set->digits)) + 1;
          iVar5 = iVar2;
          if (shift < iVar2) {
            iVar5 = shift;
          }
          shift = iVar5;
          if (iVar2 < 1) {
            return dn;
          }
        }
        if (iVar1 < 0x32) {
          uVar3 = (uint)""[iVar1];
        }
        else {
          uVar3 = (iVar1 + 2U) / 3;
        }
        decShiftToLeast(dn->lsu,uVar3,shift);
        dn->exponent = dn->exponent + shift;
        dn->digits = dn->digits - shift;
        *dropped = shift;
      }
    }
  }
  return dn;
}

Assistant:

static decNumber * decTrim(decNumber *dn, decContext *set, Flag all,
			   Int *dropped) {
  Int	d, exp;			   /* work */
  uInt	cut;			   /* .. */
  Unit	*up;			   /* -> current Unit */

  #if DECCHECK
  if (decCheckOperands(dn, DECUNUSED, DECUNUSED, DECUNCONT)) return dn;
  #endif

  *dropped=0;				/* assume no zeros dropped */
  if ((dn->bits & DECSPECIAL)		/* fast exit if special .. */
    || (*dn->lsu & 0x01)) return dn;	/* .. or odd */
  if (ISZERO(dn)) {			/* .. or 0 */
    dn->exponent=0;			/* (sign is preserved) */
    return dn;
    }

  /* have a finite number which is even */
  exp=dn->exponent;
  cut=1;			   /* digit (1-DECDPUN) in Unit */
  up=dn->lsu;			   /* -> current Unit */
  for (d=0; d<dn->digits-1; d++) { /* [don't strip the final digit] */
    /* slice by powers */
    #if DECDPUN<=4
      uInt quot=QUOT10(*up, cut);
      if ((*up-quot*powers[cut])!=0) break;  /* found non-0 digit */
    #else
      if (*up%powers[cut]!=0) break;	     /* found non-0 digit */
    #endif
    /* have a trailing 0 */
    if (!all) {			   /* trimming */
      /* [if exp>0 then all trailing 0s are significant for trim] */
      if (exp<=0) {		   /* if digit might be significant */
	if (exp==0) break;	   /* then quit */
	exp++;			   /* next digit might be significant */
	}
      }
    cut++;			   /* next power */
    if (cut>DECDPUN) {		   /* need new Unit */
      up++;
      cut=1;
      }
    } /* d */
  if (d==0) return dn;		   /* none to drop */

  /* may need to limit drop if clamping */
  if (set->clamp) {
    Int maxd=set->emax-set->digits+1-dn->exponent;
    if (maxd<=0) return dn;	   /* nothing possible */
    if (d>maxd) d=maxd;
    }

  /* effect the drop */
  decShiftToLeast(dn->lsu, D2U(dn->digits), d);
  dn->exponent+=d;		   /* maintain numerical value */
  dn->digits-=d;		   /* new length */
  *dropped=d;			   /* report the count */
  return dn;
  }